

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O2

jlong Java_fr_limsi_wapiti_WapitiJNI_new_1opt_1s(JNIEnv *jenv,jclass jcls)

{
  void *__s;
  
  __s = operator_new(0xf0);
  memset(__s,0,0xf0);
  return (jlong)__s;
}

Assistant:

SWIGEXPORT jlong JNICALL Java_fr_limsi_wapiti_WapitiJNI_new_1opt_1s(JNIEnv *jenv, jclass jcls) {
  jlong jresult = 0 ;
  opt_s *result = 0 ;
  
  (void)jenv;
  (void)jcls;
  {
    try {
      result = (opt_s *)new opt_s(); 
    }
    catch (char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, e); return 0; 
      }; 
    }
    catch (const char *e) {
      {
        SWIG_JavaException(jenv, SWIG_RuntimeError, (char*)e); return 0; 
      }; 
    }
  }
  *(opt_s **)&jresult = result; 
  return jresult;
}